

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::App::get_option_no_throw(App *this,string *option_name)

{
  pointer puVar1;
  pointer psVar2;
  App *this_00;
  pointer pcVar3;
  bool bVar4;
  Option *pOVar5;
  shared_ptr<CLI::App> *subc;
  pointer psVar6;
  pointer puVar7;
  string local_50;
  
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    bVar4 = Option::check_name((puVar7->_M_t).
                               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                               .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,option_name
                              );
    if (bVar4) {
      return (puVar7->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    }
  }
  psVar6 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar2) {
    do {
      this_00 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((this_00->name_)._M_string_length == 0) {
        pcVar3 = (option_name->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + option_name->_M_string_length);
        pOVar5 = get_option_no_throw(this_00,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (pOVar5 != (Option *)0x0) {
          return pOVar5;
        }
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  return (Option *)0x0;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const Option *App::get_option_no_throw(std::string option_name) const noexcept {
    for(const Option_p &opt : options_) {
        if(opt->check_name(option_name)) {
            return opt.get();
        }
    }
    for(const auto &subc : subcommands_) {
        // also check down into nameless subcommands
        if(subc->get_name().empty()) {
            auto *opt = subc->get_option_no_throw(option_name);
            if(opt != nullptr) {
                return opt;
            }
        }
    }
    return nullptr;
}